

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O3

int AF_AActor_A_Warp(VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,
                    VMReturn *ret,int numret)

{
  void *pvVar1;
  int iVar2;
  undefined8 *puVar3;
  PClass *pPVar4;
  int iVar5;
  int iVar6;
  undefined4 extraout_var;
  PClass *pPVar7;
  VMValue *pVVar8;
  undefined4 extraout_var_00;
  AActor *reference;
  undefined4 extraout_var_01;
  uint flags;
  char *pcVar10;
  AActor *defactor;
  bool bVar11;
  double heightoffset;
  double radiusoffset;
  FState *local_78;
  void *local_68;
  void *local_60;
  void *local_58;
  void *local_50;
  DAngle local_40;
  DAngle local_38;
  PClassActor *pPVar9;
  
  pPVar4 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
LAB_003ddbf8:
    pcVar10 = "(paramnum) < numparam";
LAB_003ddc08:
    __assert_fail(pcVar10,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1527,"int AF_AActor_A_Warp(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_003ddbef:
    pcVar10 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
    goto LAB_003ddc08;
  }
  defactor = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (defactor == (AActor *)0x0) goto LAB_003dd770;
    pPVar7 = (defactor->super_DThinker).super_DObject.Class;
    if (pPVar7 == (PClass *)0x0) {
      iVar5 = (**(defactor->super_DThinker).super_DObject._vptr_DObject)(defactor);
      pPVar7 = (PClass *)CONCAT44(extraout_var,iVar5);
      (defactor->super_DThinker).super_DObject.Class = pPVar7;
    }
    bVar11 = pPVar7 != (PClass *)0x0;
    if (pPVar7 != pPVar4 && bVar11) {
      do {
        pPVar7 = pPVar7->ParentClass;
        bVar11 = pPVar7 != (PClass *)0x0;
        if (pPVar7 == pPVar4) break;
      } while (pPVar7 != (PClass *)0x0);
    }
    if (!bVar11) {
      pcVar10 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003ddc08;
    }
  }
  else {
    if (defactor != (AActor *)0x0) goto LAB_003ddbef;
LAB_003dd770:
    defactor = (AActor *)0x0;
  }
  pPVar4 = AActor::RegistrationInfo.MyClass;
  if (numparam == 1) goto LAB_003ddbf8;
  if (param[1].field_0.field_3.Type != '\x03') goto LAB_003ddbef;
  puVar3 = (undefined8 *)param[1].field_0.field_1.a;
  if (param[1].field_0.field_1.atag == 1) {
    if (puVar3 != (undefined8 *)0x0) {
      pPVar7 = (PClass *)puVar3[1];
      if (pPVar7 == (PClass *)0x0) {
        pPVar7 = (PClass *)(**(code **)*puVar3)(puVar3);
        puVar3[1] = pPVar7;
      }
      bVar11 = pPVar7 != (PClass *)0x0;
      if (pPVar7 != pPVar4 && bVar11) {
        do {
          pPVar7 = pPVar7->ParentClass;
          bVar11 = pPVar7 != (PClass *)0x0;
          if (pPVar7 == pPVar4) break;
        } while (pPVar7 != (PClass *)0x0);
      }
      if (!bVar11) {
        pcVar10 = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
        goto LAB_003ddc08;
      }
    }
  }
  else if (puVar3 != (undefined8 *)0x0) goto LAB_003ddbef;
  if (numparam < 3) goto LAB_003ddbf8;
  if (param[2].field_0.field_3.Type != '\x03') {
    pcVar10 = "param[paramnum].Type == REGT_POINTER";
    goto LAB_003ddc08;
  }
  if (numparam == 3) {
    pcVar10 = "(paramnum) < numparam";
LAB_003ddc30:
    __assert_fail(pcVar10,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1528,"int AF_AActor_A_Warp(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if (param[3].field_0.field_3.Type != '\0') {
    pcVar10 = "param[paramnum].Type == REGT_INT";
    goto LAB_003ddc30;
  }
  iVar5 = param[3].field_0.i;
  if ((uint)numparam < 5) {
    pVVar8 = defaultparam->Array;
    if (pVVar8[4].field_0.field_3.Type != '\x01') {
      pcVar10 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
      goto LAB_003ddd59;
    }
    local_50 = pVVar8[4].field_0.field_1.a;
LAB_003dd88a:
    if (pVVar8[5].field_0.field_3.Type != '\x01') {
      pcVar10 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003ddd78:
      __assert_fail(pcVar10,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x152a,
                    "int AF_AActor_A_Warp(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    local_60 = pVVar8[5].field_0.field_1.a;
LAB_003dd899:
    if (pVVar8[6].field_0.field_3.Type != '\x01') {
      pcVar10 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003ddd09:
      __assert_fail(pcVar10,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x152b,
                    "int AF_AActor_A_Warp(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    local_68 = pVVar8[6].field_0.field_1.a;
LAB_003dd8a8:
    if (pVVar8[7].field_0.field_3.Type != '\x01') {
      pcVar10 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003ddcea:
      __assert_fail(pcVar10,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x152c,
                    "int AF_AActor_A_Warp(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    local_58 = pVVar8[7].field_0.field_1.a;
LAB_003dd8bd:
    if (pVVar8[8].field_0.field_3.Type != '\0') {
      pcVar10 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003ddccb:
      __assert_fail(pcVar10,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x152d,
                    "int AF_AActor_A_Warp(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    flags = pVVar8[8].field_0.i;
LAB_003dd8d0:
    if (pVVar8[9].field_0.field_3.Type != '\0') {
      pcVar10 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003ddcac:
      __assert_fail(pcVar10,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x152e,
                    "int AF_AActor_A_Warp(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    iVar2 = pVVar8[9].field_0.i;
    pPVar9 = (PClassActor *)(defactor->super_DThinker).super_DObject.Class;
    if (pPVar9 == (PClassActor *)0x0) {
      iVar6 = (**(defactor->super_DThinker).super_DObject._vptr_DObject)(defactor);
      pPVar9 = (PClassActor *)CONCAT44(extraout_var_00,iVar6);
      (defactor->super_DThinker).super_DObject.Class = (PClass *)pPVar9;
    }
    local_78 = FStateLabelStorage::GetState(&StateLabels,iVar2,pPVar9,false);
LAB_003dd91e:
    param = defaultparam->Array;
    if (param[10].field_0.field_3.Type != '\x01') {
      pcVar10 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003ddc8d:
      __assert_fail(pcVar10,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x152f,
                    "int AF_AActor_A_Warp(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    heightoffset = param[10].field_0.f;
LAB_003dd939:
    if (param[0xb].field_0.field_3.Type != '\x01') {
      pcVar10 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003ddc6e:
      __assert_fail(pcVar10,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1530,
                    "int AF_AActor_A_Warp(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    radiusoffset = param[0xb].field_0.f;
LAB_003dd950:
    if (param[0xc].field_0.field_3.Type != '\x01') {
      pcVar10 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003ddc4f:
      __assert_fail(pcVar10,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1531,
                    "int AF_AActor_A_Warp(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
  }
  else {
    if (param[4].field_0.field_3.Type != '\x01') {
      pcVar10 = "(param[paramnum]).Type == REGT_FLOAT";
LAB_003ddd59:
      __assert_fail(pcVar10,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1529,
                    "int AF_AActor_A_Warp(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    local_50 = (void *)param[4].field_0.f;
    if (numparam == 5) {
      pVVar8 = defaultparam->Array;
      goto LAB_003dd88a;
    }
    if (param[5].field_0.field_3.Type != '\x01') {
      pcVar10 = "(param[paramnum]).Type == REGT_FLOAT";
      goto LAB_003ddd78;
    }
    local_60 = (void *)param[5].field_0.f;
    if ((uint)numparam < 7) {
      pVVar8 = defaultparam->Array;
      goto LAB_003dd899;
    }
    if (param[6].field_0.field_3.Type != '\x01') {
      pcVar10 = "(param[paramnum]).Type == REGT_FLOAT";
      goto LAB_003ddd09;
    }
    local_68 = (void *)param[6].field_0.f;
    if (numparam == 7) {
      pVVar8 = defaultparam->Array;
      goto LAB_003dd8a8;
    }
    if (param[7].field_0.field_3.Type != '\x01') {
      pcVar10 = "(param[paramnum]).Type == REGT_FLOAT";
      goto LAB_003ddcea;
    }
    local_58 = param[7].field_0.field_1.a;
    if ((uint)numparam < 9) {
      pVVar8 = defaultparam->Array;
      goto LAB_003dd8bd;
    }
    if (param[8].field_0.field_3.Type != '\0') {
      pcVar10 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003ddccb;
    }
    flags = param[8].field_0.i;
    if (numparam == 9) {
      pVVar8 = defaultparam->Array;
      goto LAB_003dd8d0;
    }
    if (param[9].field_0.field_3.Type != '\0') {
      pcVar10 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003ddcac;
    }
    iVar2 = param[9].field_0.i;
    pPVar9 = (PClassActor *)(defactor->super_DThinker).super_DObject.Class;
    if (pPVar9 == (PClassActor *)0x0) {
      iVar6 = (**(defactor->super_DThinker).super_DObject._vptr_DObject)(defactor);
      pPVar9 = (PClassActor *)CONCAT44(extraout_var_01,iVar6);
      (defactor->super_DThinker).super_DObject.Class = (PClass *)pPVar9;
    }
    local_78 = FStateLabelStorage::GetState(&StateLabels,iVar2,pPVar9,false);
    if ((uint)numparam < 0xb) goto LAB_003dd91e;
    if (param[10].field_0.field_3.Type != '\x01') {
      pcVar10 = "(param[paramnum]).Type == REGT_FLOAT";
      goto LAB_003ddc8d;
    }
    heightoffset = param[10].field_0.f;
    if (numparam == 0xb) {
      param = defaultparam->Array;
      goto LAB_003dd939;
    }
    if (param[0xb].field_0.field_3.Type != '\x01') {
      pcVar10 = "(param[paramnum]).Type == REGT_FLOAT";
      goto LAB_003ddc6e;
    }
    radiusoffset = param[0xb].field_0.f;
    if ((uint)numparam < 0xd) {
      param = defaultparam->Array;
      goto LAB_003dd950;
    }
    if (param[0xc].field_0.field_3.Type != '\x01') {
      pcVar10 = "(param[paramnum]).Type == REGT_FLOAT";
      goto LAB_003ddc4f;
    }
  }
  pvVar1 = param[0xc].field_0.field_1.a;
  if (numret < 2) {
    iVar2 = 1;
    if (numret == 1) goto LAB_003dd9a5;
    bVar11 = false;
  }
  else {
    if (ret[1].RegType != '\0') goto LAB_003ddd2a;
    *(undefined4 *)ret[1].Location = 0;
    iVar2 = 2;
LAB_003dd9a5:
    numret = iVar2;
    VMReturn::SetPointer(ret,(void *)0x0,0);
    bVar11 = true;
  }
  if ((flags >> 0xd & 1) == 0) {
    reference = COPY_AAPTR(defactor,iVar5);
  }
  else {
    reference = SingleActorFromTID(iVar5,defactor);
  }
  if (reference != (AActor *)0x0) {
    local_38.Degrees = (double)local_58;
    local_40.Degrees = (double)pvVar1;
    iVar5 = P_Thing_Warp(defactor,reference,(double)local_50,(double)local_60,(double)local_68,
                         &local_38,flags,heightoffset,radiusoffset,&local_40);
    if (iVar5 != 0) {
      if (local_78 == (FState *)0x0) {
        if (1 < numret) {
          if (ret[1].RegType != '\0') {
LAB_003ddd2a:
            __assert_fail("RegType == REGT_INT",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/vm/vm.h"
                          ,0x13f,"void VMReturn::SetInt(int)");
          }
          *(undefined4 *)ret[1].Location = 1;
        }
      }
      else if (bVar11) {
        VMReturn::SetPointer(ret,local_78,0);
      }
    }
  }
  return numret;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_Warp)
{
	PARAM_ACTION_PROLOGUE(AActor);
	PARAM_INT(destination_selector);
	PARAM_FLOAT_DEF(xofs)				
	PARAM_FLOAT_DEF(yofs)				
	PARAM_FLOAT_DEF(zofs)				
	PARAM_ANGLE_DEF(angle)				
	PARAM_INT_DEF(flags)				
	PARAM_STATE_DEF(success_state)		
	PARAM_FLOAT_DEF(heightoffset)		
	PARAM_FLOAT_DEF(radiusoffset)		
	PARAM_ANGLE_DEF(pitch)				
	
	AActor *reference;

	// A_Teleport and A_Warp were the only codepointers that can state jump
	// *AND* have a meaningful inventory state chain result. Grrr.
	if (numret > 1)
	{
		ret[1].SetInt(false);
		numret = 2;
	}
	if (numret > 0)
	{
		ret[0].SetPointer(NULL, ATAG_STATE);
	}

	if ((flags & WARPF_USETID))
	{
		reference = SingleActorFromTID(destination_selector, self);
	}
	else
	{
		reference = COPY_AAPTR(self, destination_selector);
	}

	//If there is no actor to warp to, fail.
	if (!reference)
	{
		return numret;
	}

	if (P_Thing_Warp(self, reference, xofs, yofs, zofs, angle, flags, heightoffset, radiusoffset, pitch))
	{
		if (success_state)
		{
			// Jumps should never set the result for inventory state chains!
			// in this case, you have the statejump to help you handle all the success anyway.
			if (numret > 0)
			{
				ret[0].SetPointer(success_state, ATAG_STATE);
			}
		}
		else if (numret > 1)
		{
			ret[1].SetInt(true);
		}
	}
	return numret;
}